

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

Instr * __thiscall
GlobOpt::ToTypeSpecIndex(GlobOpt *this,Instr *instr,RegOpnd *indexOpnd,IndirOpnd *indirOpnd)

{
  BasicBlock *block;
  code *pcVar1;
  IndirOpnd *regOpnd;
  bool bVar2;
  BOOLEAN BVar3;
  int32 min1;
  int32 max1;
  RegOpnd *pRVar4;
  undefined4 *puVar5;
  ValueInfo *pVVar6;
  GlobOptBlockData *pGVar7;
  Value *pVVar8;
  IntConstantBounds local_70;
  byte local_62;
  bool local_61;
  IntConstantBounds local_50;
  IntConstantBounds indexConstantBounds;
  Opnd *intOpnd;
  Value *indexValue;
  StackSym *indexVarSym;
  IndirOpnd *pIStack_28;
  bool isGetterOrSetter;
  IndirOpnd *indirOpnd_local;
  RegOpnd *indexOpnd_local;
  Instr *instr_local;
  GlobOpt *this_local;
  
  pIStack_28 = indirOpnd;
  indirOpnd_local = (IndirOpnd *)indexOpnd;
  indexOpnd_local = (RegOpnd *)instr;
  instr_local = (Instr *)this;
  if ((indirOpnd == (IndirOpnd *)0x0) &&
     (pRVar4 = (RegOpnd *)IR::Instr::GetSrc1(instr), indexOpnd != pRVar4)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x2c29,"(indirOpnd != nullptr || indexOpnd == instr->GetSrc1())",
                       "indirOpnd != nullptr || indexOpnd == instr->GetSrc1()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  local_61 = true;
  if (((*(short *)&indexOpnd_local[1].m_sym != 0x155) &&
      (local_61 = true, *(short *)&indexOpnd_local[1].m_sym != 0x154)) &&
     (local_61 = true, *(short *)&indexOpnd_local[1].m_sym != 0x11b)) {
    local_61 = *(short *)&indexOpnd_local[1].m_sym == 0x11a;
  }
  indexVarSym._7_1_ = local_61;
  local_62 = 0;
  if (local_61 != false) goto LAB_005a8ea5;
  indexVarSym._4_2_ =
       (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
       IR::Opnd::GetValueType(&indirOpnd_local->super_Opnd);
  bVar2 = ValueType::IsInt((ValueType *)((long)&indexVarSym + 4));
  if (bVar2) {
    bVar2 = IsTypeSpecPhaseOff(this->func);
    local_62 = 0;
    if (bVar2) goto LAB_005a8ea5;
  }
  else {
    indexVarSym._2_2_ =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         IR::Opnd::GetValueType(&indirOpnd_local->super_Opnd);
    bVar2 = ValueType::IsLikelyInt((ValueType *)((long)&indexVarSym + 2));
    local_62 = 0;
    if (!bVar2) goto LAB_005a8ea5;
    bVar2 = DoAggressiveIntTypeSpec(this);
    local_62 = 0;
    if (!bVar2) goto LAB_005a8ea5;
  }
  bVar2 = GetIsAsmJSFunc(this);
  local_62 = bVar2 ^ 0xff;
LAB_005a8ea5:
  if ((local_62 & 1) == 0) {
    pGVar7 = CurrentBlockData(this);
    BVar3 = BVSparse<Memory::JitArenaAllocator>::Test
                      (pGVar7->liveVarSyms,*(BVIndex *)&indirOpnd_local->m_baseOpnd->m_sym);
    pRVar4 = indexOpnd_local;
    regOpnd = indirOpnd_local;
    if (BVar3 == '\0') {
      block = this->currentBlock;
      pGVar7 = CurrentBlockData(this);
      pVVar8 = GlobOptBlockData::FindValue(pGVar7,(Sym *)indirOpnd_local->m_baseOpnd);
      indexOpnd_local = (RegOpnd *)ToVar(this,(Instr *)pRVar4,(RegOpnd *)regOpnd,block,pVVar8,true);
    }
  }
  else {
    pRVar4 = indirOpnd_local->m_baseOpnd;
    pGVar7 = CurrentBlockData(this);
    pVVar8 = GlobOptBlockData::FindValue(pGVar7,(Sym *)pRVar4);
    if (pVVar8 == (Value *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x2c38,"(indexValue)","indexValue");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    pVVar6 = ::Value::GetValueInfo(pVVar8);
    bVar2 = ValueType::IsLikelyInt(&pVVar6->super_ValueType);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x2c39,"(indexValue->GetValueInfo()->IsLikelyInt())",
                         "indexValue->GetValueInfo()->IsLikelyInt()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    ToInt32(this,(Instr *)indexOpnd_local,&indirOpnd_local->super_Opnd,this->currentBlock,pVVar8,
            pIStack_28,false);
    pVVar6 = ::Value::GetValueInfo(pVVar8);
    bVar2 = ValueType::IsInt(&pVVar6->super_ValueType);
    if ((!bVar2) && (bVar2 = IsLoopPrePass(this), !bVar2)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x2c3c,"(indexValue->GetValueInfo()->IsInt() || IsLoopPrePass())",
                         "indexValue->GetValueInfo()->IsInt() || IsLoopPrePass()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    bVar2 = IsLoopPrePass(this);
    if (!bVar2) {
      if (pIStack_28 == (IndirOpnd *)0x0) {
        local_70 = (IntConstantBounds)IR::Instr::GetSrc1((Instr *)indexOpnd_local);
      }
      else {
        local_70 = (IntConstantBounds)IR::IndirOpnd::GetIndexOpnd(pIStack_28);
      }
      indexConstantBounds = local_70;
      if (local_70 != (IntConstantBounds)0x0) {
        bVar2 = IR::Opnd::IsRegOpnd((Opnd *)local_70);
        if (bVar2) {
          pRVar4 = IR::Opnd::AsRegOpnd((Opnd *)indexConstantBounds);
          bVar2 = StackSym::IsTypeSpec(pRVar4->m_sym);
          if (!bVar2) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar5 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                               ,0x2c43,
                               "(!intOpnd->IsRegOpnd() || intOpnd->AsRegOpnd()->m_sym->IsTypeSpec())"
                               ,"!intOpnd->IsRegOpnd() || intOpnd->AsRegOpnd()->m_sym->IsTypeSpec()"
                              );
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar5 = 0;
          }
        }
        IntConstantBounds::IntConstantBounds(&local_50);
        pVVar6 = ::Value::GetValueInfo(pVVar8);
        bVar2 = ValueInfo::TryGetIntConstantBounds(pVVar6,&local_50,false);
        if (!bVar2) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                             ,0x2c45,
                             "(indexValue->GetValueInfo()->TryGetIntConstantBounds(&indexConstantBounds))"
                             ,
                             "indexValue->GetValueInfo()->TryGetIntConstantBounds(&indexConstantBounds)"
                            );
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 0;
        }
        min1 = IntConstantBounds::LowerBound(&local_50);
        max1 = IntConstantBounds::UpperBound(&local_50);
        bVar2 = ValueInfo::IsGreaterThanOrEqualTo(pVVar8,min1,max1,(Value *)0x0,0,0);
        if (bVar2) {
          IR::Opnd::SetType((Opnd *)indexConstantBounds,TyUint32);
        }
      }
    }
  }
  return (Instr *)indexOpnd_local;
}

Assistant:

IR::Instr * 
GlobOpt::ToTypeSpecIndex(IR::Instr * instr, IR::RegOpnd * indexOpnd, IR::IndirOpnd * indirOpnd)
{
    Assert(indirOpnd != nullptr || indexOpnd == instr->GetSrc1());

    bool isGetterOrSetter = instr->m_opcode == Js::OpCode::InitGetElemI ||
        instr->m_opcode == Js::OpCode::InitSetElemI ||
        instr->m_opcode == Js::OpCode::InitClassMemberGetComputedName ||
        instr->m_opcode == Js::OpCode::InitClassMemberSetComputedName;

    if (!isGetterOrSetter // typespec is disabled for getters, setters
        && (indexOpnd->GetValueType().IsInt()
            ? !IsTypeSpecPhaseOff(func)
            : indexOpnd->GetValueType().IsLikelyInt() && DoAggressiveIntTypeSpec())
        && !GetIsAsmJSFunc()) // typespec is disabled for asmjs
    {
        StackSym *const indexVarSym = indexOpnd->m_sym;
        Value *const indexValue = CurrentBlockData()->FindValue(indexVarSym);
        Assert(indexValue);
        Assert(indexValue->GetValueInfo()->IsLikelyInt());

        ToInt32(instr, indexOpnd, currentBlock, indexValue, indirOpnd, false);
        Assert(indexValue->GetValueInfo()->IsInt() || IsLoopPrePass());

        if (!IsLoopPrePass())
        {
            IR::Opnd * intOpnd = indirOpnd ? indirOpnd->GetIndexOpnd() : instr->GetSrc1();
            if (intOpnd != nullptr)
            {
                Assert(!intOpnd->IsRegOpnd() || intOpnd->AsRegOpnd()->m_sym->IsTypeSpec());
                IntConstantBounds indexConstantBounds;
                AssertVerify(indexValue->GetValueInfo()->TryGetIntConstantBounds(&indexConstantBounds));
                if (ValueInfo::IsGreaterThanOrEqualTo(
                    indexValue,
                    indexConstantBounds.LowerBound(),
                    indexConstantBounds.UpperBound(),
                    nullptr,
                    0,
                    0))
                {
                    intOpnd->SetType(TyUint32);
                }
            }
        }
    }
    else if (!CurrentBlockData()->liveVarSyms->Test(indexOpnd->m_sym->m_id))
    {
        instr = this->ToVar(instr, indexOpnd, this->currentBlock, CurrentBlockData()->FindValue(indexOpnd->m_sym), true);
    }
    return instr;
}